

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

uint count(uint *v,uint len,uint item)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  for (uVar2 = 0; len != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = uVar1 + (v[uVar2] == item);
  }
  return uVar1;
}

Assistant:

uint32_t count(uint32_t *v, uint32_t len, uint32_t item)
{
    uint32_t c = 0;
    for (uint32_t i = 0; i < len; i++)
        if (v[i] == item)
            c++;
    return c;
}